

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_mcrxr(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGv_i32 ret;
  uintptr_t o;
  TCGv_i32 pTVar1;
  TCGv_i32 ret_00;
  
  s = ctx->uc->tcg_ctx;
  ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I32,false);
  ret_00 = (TCGv_i32)((long)ts - (long)s);
  ts_00 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I32,false);
  ret = (TCGv_i32)((long)ts_00 - (long)s);
  pTVar1 = *(TCGv_i32 *)((long)cpu_crf + (ulong)(ctx->opcode >> 0x14 & 0x38));
  tcg_gen_extrl_i64_i32_ppc64(s,ret_00,cpu_so);
  tcg_gen_extrl_i64_i32_ppc64(s,ret,cpu_ov);
  tcg_gen_extrl_i64_i32_ppc64(s,pTVar1,cpu_ca);
  tcg_gen_shli_i32_ppc64(s,ret_00,ret_00,3);
  tcg_gen_shli_i32_ppc64(s,ret,ret,2);
  tcg_gen_shli_i32_ppc64(s,pTVar1,pTVar1,1);
  pTVar1 = pTVar1 + (long)s;
  tcg_gen_op3_ppc64(s,INDEX_op_or_i32,(TCGArg)pTVar1,(TCGArg)pTVar1,(TCGArg)ts);
  tcg_gen_op3_ppc64(s,INDEX_op_or_i32,(TCGArg)pTVar1,(TCGArg)pTVar1,(TCGArg)ts_00);
  tcg_temp_free_internal_ppc64(s,ts);
  tcg_temp_free_internal_ppc64(s,ts_00);
  tcg_gen_op2_ppc64(s,INDEX_op_movi_i64,(TCGArg)(cpu_so + (long)s),0);
  tcg_gen_op2_ppc64(s,INDEX_op_movi_i64,(TCGArg)(cpu_ov + (long)s),0);
  tcg_gen_op2_ppc64(s,INDEX_op_movi_i64,(TCGArg)(cpu_ca + (long)s),0);
  return;
}

Assistant:

static void gen_mcrxr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 dst = cpu_crf[crfD(ctx->opcode)];

    tcg_gen_trunc_tl_i32(tcg_ctx, t0, cpu_so);
    tcg_gen_trunc_tl_i32(tcg_ctx, t1, cpu_ov);
    tcg_gen_trunc_tl_i32(tcg_ctx, dst, cpu_ca);
    tcg_gen_shli_i32(tcg_ctx, t0, t0, 3);
    tcg_gen_shli_i32(tcg_ctx, t1, t1, 2);
    tcg_gen_shli_i32(tcg_ctx, dst, dst, 1);
    tcg_gen_or_i32(tcg_ctx, dst, dst, t0);
    tcg_gen_or_i32(tcg_ctx, dst, dst, t1);
    tcg_temp_free_i32(tcg_ctx, t0);
    tcg_temp_free_i32(tcg_ctx, t1);

    tcg_gen_movi_tl(tcg_ctx, cpu_so, 0);
    tcg_gen_movi_tl(tcg_ctx, cpu_ov, 0);
    tcg_gen_movi_tl(tcg_ctx, cpu_ca, 0);
}